

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLRefInfo.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLRefInfo::serialize(XMLRefInfo *this,XSerializeEngine *serEng)

{
  XMLSize_t dummyDataLen;
  XMLSize_t dummyBufferLen;
  XMLSize_t local_20;
  XMLSize_t local_18;
  
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::operator>>(serEng,&this->fDeclared);
    XSerializeEngine::operator>>(serEng,&this->fUsed);
    XSerializeEngine::readString(serEng,&this->fRefName,&local_18,&local_20,false);
    return;
  }
  XSerializeEngine::operator<<(serEng,this->fDeclared);
  XSerializeEngine::operator<<(serEng,this->fUsed);
  XSerializeEngine::writeString(serEng,this->fRefName,0,false);
  return;
}

Assistant:

void XMLRefInfo::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {   
        serEng<<fDeclared;
        serEng<<fUsed;
        serEng.writeString(fRefName);
    }
    else
    {
        serEng>>fDeclared;
        serEng>>fUsed;
        serEng.readString(fRefName);
    }

}